

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol_edge_state.cpp
# Opt level: O3

void MOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BCRec *bcrec;
  double *pdVar15;
  int iVar16;
  pair<bool,_bool> pVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  double *pdVar44;
  int iVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  bool bVar55;
  bool bVar56;
  ulong uVar57;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  ulong uVar67;
  double dVar68;
  ulong uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  ulong local_250;
  uint local_234;
  double *local_230;
  ulong local_220;
  ulong local_208;
  double *local_200;
  double *local_1f8;
  long local_1e8;
  double *local_1e0;
  double *local_1d8;
  long local_1c0;
  double *local_1a0;
  double *local_190;
  double *local_178;
  double *local_160;
  long local_150;
  double *local_148;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_100;
  double *local_f8;
  double *local_d0;
  double *local_c8;
  
  iVar1 = (domain->smallend).vect[0];
  iVar2 = (domain->smallend).vect[2];
  lVar52 = (long)iVar1;
  iVar3 = (domain->bigend).vect[0];
  iVar4 = (bx->bigend).vect[0];
  iVar5 = (bx->bigend).vect[1];
  uVar6 = (bx->btype).itype;
  iVar42 = (~uVar6 & 1) + iVar4;
  iVar34 = iVar5 + (uint)((uVar6 & 2) == 0);
  iVar7 = (domain->smallend).vect[1];
  lVar24 = (long)iVar7;
  iVar8 = (domain->bigend).vect[1];
  lVar25 = (long)iVar8;
  iVar9 = (domain->bigend).vect[2];
  iVar10 = (bx->smallend).vect[0];
  iVar11 = (bx->smallend).vect[2];
  iVar12 = (bx->smallend).vect[1];
  lVar19 = (long)iVar12;
  iVar50 = (bx->bigend).vect[2];
  iVar18 = iVar50 + (uint)((uVar6 & 4) == 0);
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  lVar31 = (long)iVar10;
  pVar17 = anon_unknown.dwarf_5208a2::has_extdir_or_ho(bcrec,ncomp,0);
  if (((pVar17.first & iVar10 + -1 <= iVar1) == 0) &&
     ((((ushort)pVar17 >> 8 & 1) == 0 || (iVar42 < iVar3)))) {
    local_1e0 = q->p;
    local_1c0 = q->jstride;
    local_150 = q->kstride;
    local_1e8 = q->nstride;
    local_234 = (q->begin).z;
    if (0 < ncomp) {
      uVar6 = (q->begin).x;
      lVar21 = umac->jstride;
      lVar29 = xedge->jstride;
      lVar38 = (long)(umac->begin).y;
      lVar26 = (long)(umac->begin).x;
      lVar46 = (long)(q->begin).y;
      local_190 = xedge->p +
                  (((lVar19 - (xedge->begin).y) * lVar29 + lVar31) - (long)(xedge->begin).x);
      pdVar15 = umac->p;
      lVar41 = umac->kstride;
      iVar1 = (umac->begin).z;
      lVar54 = xedge->kstride;
      lVar48 = xedge->nstride;
      iVar13 = (xedge->begin).z;
      lVar43 = (iVar3 + 1) - lVar31;
      local_120 = local_1e0 + (((lVar19 - lVar46) * local_1c0 + lVar31) - (long)(int)uVar6);
      local_250 = 0;
      do {
        if (iVar11 <= iVar50) {
          lVar51 = local_250 * local_1e8;
          iVar45 = iVar11;
          do {
            if (iVar12 <= iVar5) {
              lVar27 = (long)iVar45;
              pdVar32 = (double *)((lVar27 - iVar13) * lVar54 * 8 + (long)local_190);
              lVar30 = (long)pdVar15 +
                       (lVar27 - iVar1) * lVar41 * 8 +
                       lVar31 * 8 + (lVar19 - lVar38) * lVar21 * 8 + lVar26 * -8;
              pdVar23 = (double *)((lVar27 - (int)local_234) * local_150 * 8 + (long)local_120);
              lVar28 = (int)(iVar45 - local_234) * local_150;
              lVar20 = (iVar45 - iVar1) * lVar41;
              lVar27 = lVar19;
              do {
                if (iVar10 <= iVar42) {
                  lVar39 = (lVar27 - lVar46) * local_1c0;
                  iVar35 = d_bcrec_ptr[local_250].bc[3];
                  lVar40 = (lVar27 - lVar38) * lVar21;
                  lVar53 = 0;
                  do {
                    dVar58 = pdVar23[lVar53];
                    iVar16 = (int)lVar53;
                    dVar64 = local_1e0[lVar51 + lVar28 + lVar39 + (int)(iVar16 + ~uVar6 + iVar10)];
                    dVar65 = (dVar58 - dVar64) + (dVar58 - dVar64);
                    dVar68 = local_1e0[lVar51 + lVar28 + lVar39 + (int)((iVar10 - uVar6) + 1 +
                                                                       iVar16)] - dVar58;
                    dVar66 = dVar64 - local_1e0[lVar51 + lVar28 + lVar39 + (int)((iVar10 - uVar6) +
                                                                                 -2 + iVar16)];
                    dVar68 = dVar68 + dVar68;
                    dVar66 = dVar66 + dVar66;
                    auVar77._0_8_ = ABS(dVar68);
                    auVar77._8_8_ = ABS(dVar65);
                    dVar63 = (local_1e0[lVar51 + lVar28 + lVar39 + (int)((iVar10 - uVar6) + 1 +
                                                                        iVar16)] - dVar64) * 0.5;
                    dVar59 = (dVar58 - local_1e0[lVar51 + lVar28 + lVar39 + (int)((iVar10 - uVar6) +
                                                                                  -2 + iVar16)]) *
                             0.5;
                    uVar67 = -(ulong)(0.0 < dVar63);
                    uVar57 = -(ulong)(0.0 < dVar59);
                    auVar73._0_8_ = ABS(dVar63);
                    auVar73._8_8_ = ABS(dVar59);
                    auVar74._8_8_ = ABS(dVar66);
                    auVar74._0_8_ = auVar77._8_8_;
                    auVar74 = minpd(auVar73,auVar74);
                    auVar77 = minpd(auVar77,auVar74);
                    uVar69 = -(ulong)(0.0 < dVar65 * dVar68) & auVar77._0_8_;
                    uVar72 = -(ulong)(0.0 < dVar65 * dVar66) & auVar77._8_8_;
                    dVar65 = (double)(~uVar67 & (uVar69 ^ 0x8000000000000000) | uVar69 & uVar67) *
                             -0.5 + dVar58;
                    dVar66 = (double)(~uVar57 & (uVar72 ^ 0x8000000000000000) | uVar72 & uVar57) *
                             0.5 + dVar64;
                    dVar68 = dVar65;
                    if (lVar52 - lVar31 == lVar53) {
                      switch(d_bcrec_ptr[local_250].bc[0]) {
                      case 1:
switchD_003adb63_caseD_1:
                        dVar66 = dVar65;
                        break;
                      case 2:
                      case 4:
                        if ((local_250 != 0 || !is_velocity) ||
                            pdVar15[lVar20 + lVar40 + (lVar52 - lVar26)] < 0.0)
                        goto switchD_003adb63_caseD_1;
                        dVar68 = 0.0;
                        dVar66 = 0.0;
                        if (dVar65 <= 0.0) {
                          dVar68 = dVar65;
                          dVar66 = dVar65;
                        }
                        break;
                      case 3:
                        dVar66 = dVar64;
                        if (local_250 == 0 && is_velocity) {
                          dVar68 = dVar64;
                        }
                        break;
                      case -1:
switchD_003adb63_caseD_ffffffff:
                        dVar68 = 0.0;
                        dVar66 = 0.0;
                      }
                    }
                    else if (lVar43 == lVar53) {
                      switch(iVar35) {
                      case 1:
                      case 2:
                      case 4:
                        dVar68 = dVar66;
                        break;
                      case 3:
                        dVar68 = dVar58;
                        if (local_250 == 0 && is_velocity) {
                          dVar66 = dVar58;
                        }
                        break;
                      case -1:
                        goto switchD_003adb63_caseD_ffffffff;
                      }
                    }
                    dVar58 = dVar66;
                    if (((lVar43 == lVar53) && ((iVar35 == 4 || (iVar35 == 2)))) &&
                       ((dVar68 = dVar66,
                        (local_250 == 0 && is_velocity) &&
                        pdVar15[lVar20 + lVar40 + ((iVar3 + 1) - lVar26)] <= 0.0 &&
                        (dVar68 = 0.0, dVar58 = 0.0, 0.0 <= dVar66)))) {
                      dVar68 = dVar66;
                      dVar58 = dVar66;
                    }
                    dVar64 = *(double *)(lVar30 + lVar53 * 8);
                    dVar66 = dVar58;
                    if ((dVar64 <= 1e-08) && (dVar66 = dVar68, -1e-08 <= dVar64)) {
                      dVar66 = (dVar58 + dVar68) * 0.5;
                    }
                    pdVar32[lVar53] = dVar66;
                    lVar53 = lVar53 + 1;
                  } while ((iVar42 - iVar10) + 1 != (int)lVar53);
                }
                lVar27 = lVar27 + 1;
                pdVar32 = pdVar32 + lVar29;
                lVar30 = lVar30 + lVar21 * 8;
                pdVar23 = pdVar23 + local_1c0;
              } while (iVar5 + 1 != (int)lVar27);
            }
            bVar56 = iVar45 != iVar50;
            iVar45 = iVar45 + 1;
          } while (bVar56);
        }
        local_250 = local_250 + 1;
        local_190 = local_190 + lVar48;
        local_120 = local_120 + local_1e8;
      } while (local_250 != (uint)ncomp);
    }
  }
  else {
    local_1e0 = q->p;
    local_1c0 = q->jstride;
    local_150 = q->kstride;
    local_1e8 = q->nstride;
    local_234 = (q->begin).z;
    if (0 < ncomp) {
      lVar21 = umac->jstride;
      lVar29 = xedge->jstride;
      lVar46 = (long)(umac->begin).y;
      lVar38 = (long)(umac->begin).x;
      lVar43 = (long)(q->begin).y;
      uVar6 = (q->begin).x;
      iVar35 = iVar3 + 1;
      pdVar15 = umac->p;
      lVar41 = umac->kstride;
      iVar13 = (umac->begin).z;
      local_c8 = xedge->p +
                 (((lVar19 - (xedge->begin).y) * lVar29 + lVar31) - (long)(xedge->begin).x);
      lVar54 = xedge->kstride;
      lVar48 = xedge->nstride;
      iVar45 = (xedge->begin).z;
      lVar26 = iVar35 - lVar31;
      local_d0 = local_1e0 + (((lVar19 - lVar43) * local_1c0 + lVar31) - (long)(int)uVar6);
      local_208 = 0;
      do {
        if (iVar11 <= iVar50) {
          bVar56 = local_208 == 0 && is_velocity;
          lVar51 = local_208 * local_1e8;
          iVar16 = iVar11;
          do {
            if (iVar12 <= iVar5) {
              lVar27 = (long)iVar16;
              lVar20 = (long)pdVar15 +
                       (lVar27 - iVar13) * lVar41 * 8 +
                       lVar31 * 8 + (lVar19 - lVar46) * lVar21 * 8 + lVar38 * -8;
              pdVar23 = (double *)((lVar27 - iVar45) * lVar54 * 8 + (long)local_c8);
              pdVar32 = (double *)((lVar27 - (int)local_234) * local_150 * 8 + (long)local_d0);
              lVar30 = (int)(iVar16 - local_234) * local_150;
              lVar28 = (iVar16 - iVar13) * lVar41;
              lVar27 = lVar19;
              do {
                if (iVar10 <= iVar42) {
                  iVar37 = d_bcrec_ptr[local_208].bc[0];
                  iVar14 = d_bcrec_ptr[local_208].bc[3];
                  lVar39 = (lVar27 - lVar43) * local_1c0;
                  lVar53 = (lVar27 - lVar46) * lVar21;
                  lVar40 = 0;
                  do {
                    if ((iVar37 == 3) && (lVar31 + lVar40 <= lVar52)) {
                      dVar58 = local_1e0[lVar39 + lVar30 + (int)(~uVar6 + iVar1) + lVar51];
                      goto LAB_003ad5df;
                    }
                    if ((iVar14 == 3) && ((long)iVar3 < lVar31 + lVar40)) {
                      dVar58 = local_1e0[lVar39 + lVar30 + (int)(iVar35 - uVar6) + lVar51];
                      goto LAB_003ad5df;
                    }
                    dVar68 = pdVar32[lVar40 + -1];
                    dVar64 = pdVar32[lVar40];
                    iVar36 = (int)lVar40;
                    dVar58 = local_1e0[lVar39 + lVar30 + lVar51 + (int)((iVar10 - uVar6) + 1 +
                                                                       iVar36)];
                    if (lVar52 - lVar31 == lVar40 && iVar37 - 3U < 2) {
                      dVar66 = dVar68 * -4.0 + dVar64 * 3.0 + dVar58;
LAB_003ad311:
                      dVar66 = dVar66 / 3.0;
                    }
                    else {
                      dVar66 = (dVar58 - dVar68) * 0.5;
                      if ((iVar37 == 4 || iVar14 == 3) && iVar3 - lVar31 == lVar40) {
                        dVar66 = (dVar58 * 4.0 + dVar64 * -3.0) - dVar68;
                        goto LAB_003ad311;
                      }
                    }
                    dVar62 = (dVar64 - dVar68) + (dVar64 - dVar68);
                    dVar59 = (dVar58 - dVar64) + (dVar58 - dVar64);
                    dVar58 = ABS(dVar62);
                    dVar63 = ABS(dVar59);
                    dVar65 = ABS(dVar66);
                    if (dVar58 <= ABS(dVar66)) {
                      dVar65 = dVar58;
                    }
                    if (dVar65 <= dVar63) {
                      dVar63 = dVar65;
                    }
                    uVar67 = -(ulong)(0.0 < dVar62 * dVar59) & (ulong)dVar63;
                    dVar65 = local_1e0[lVar39 + lVar30 + lVar51 + (int)((iVar10 - uVar6) + -2 +
                                                                       iVar36)];
                    if ((iVar37 - 3U < 2) && ((iVar1 - iVar10) + 1 == iVar36)) {
                      dVar63 = dVar65 * -4.0 + dVar68 * 3.0 + dVar64;
LAB_003ad41d:
                      dVar63 = dVar63 / 3.0;
                    }
                    else {
                      dVar63 = (dVar64 - dVar65) * 0.5;
                      if ((iVar37 == 4 || iVar14 == 3) && iVar35 - iVar10 == iVar36) {
                        dVar63 = (dVar64 * 4.0 + dVar68 * -3.0) - dVar65;
                        goto LAB_003ad41d;
                      }
                    }
                    dVar78 = (double)(~-(ulong)(0.0 < dVar66) & (uVar67 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar66) & uVar67) * -0.5 + dVar64;
                    dVar65 = (dVar68 - dVar65) + (dVar68 - dVar65);
                    dVar59 = ABS(dVar65);
                    dVar66 = ABS(dVar63);
                    if (dVar59 <= ABS(dVar63)) {
                      dVar66 = dVar59;
                    }
                    if (dVar66 <= dVar58) {
                      dVar58 = dVar66;
                    }
                    uVar67 = -(ulong)(0.0 < dVar62 * dVar65) & (ulong)dVar58;
                    dVar68 = (double)(~-(ulong)(0.0 < dVar63) & (uVar67 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar63) & uVar67) * 0.5 + dVar68;
                    if (lVar52 - lVar31 != lVar40) {
                      if (lVar26 == lVar40) {
                        switch(iVar14) {
                        case 1:
                        case 2:
                        case 4:
                          goto switchD_003ad51b_caseD_1;
                        case 3:
                          if (bVar56) {
                            dVar68 = dVar64;
                          }
                          goto LAB_003ad553;
                        case -1:
                          goto switchD_003ad4b1_caseD_ffffffff;
                        }
                      }
                      goto switchD_003ad4b1_caseD_0;
                    }
                    switch(iVar37) {
                    case 1:
switchD_003ad4b1_caseD_1:
                      dVar68 = dVar78;
                      break;
                    case 2:
                    case 4:
                      if ((local_208 != 0 || !is_velocity) ||
                          pdVar15[lVar28 + lVar53 + (lVar52 - lVar38)] < 0.0)
                      goto switchD_003ad4b1_caseD_1;
                      dVar68 = 0.0;
                      if (dVar78 <= 0.0) {
                        dVar68 = dVar78;
                      }
switchD_003ad51b_caseD_1:
                      dVar64 = dVar68;
                      dVar68 = dVar64;
                      goto LAB_003ad553;
                    case 3:
                      dVar68 = local_1e0[lVar39 + lVar30 + lVar51 + (int)(~uVar6 + iVar1)];
                      if (bVar56) goto switchD_003ad51b_caseD_1;
                      break;
                    case -1:
switchD_003ad4b1_caseD_ffffffff:
                      dVar64 = 0.0;
                      dVar68 = 0.0;
                      goto LAB_003ad553;
                    }
switchD_003ad4b1_caseD_0:
                    dVar64 = dVar78;
LAB_003ad553:
                    dVar66 = dVar68;
                    if (((lVar26 == lVar40) &&
                        (((iVar14 == 4 || (iVar14 == 2)) &&
                         (dVar64 = dVar68,
                         (local_208 == 0 && is_velocity) &&
                         pdVar15[lVar28 + lVar53 + (iVar35 - lVar38)] <= 0.0)))) &&
                       (dVar64 = 0.0, dVar66 = 0.0, 0.0 <= dVar68)) {
                      dVar64 = dVar68;
                      dVar66 = dVar68;
                    }
                    dVar68 = *(double *)(lVar20 + lVar40 * 8);
                    dVar58 = dVar66;
                    if ((dVar68 <= 1e-08) && (dVar58 = dVar64, -1e-08 <= dVar68)) {
                      dVar58 = (dVar66 + dVar64) * 0.5;
                    }
LAB_003ad5df:
                    pdVar23[lVar40] = dVar58;
                    lVar40 = lVar40 + 1;
                  } while ((iVar42 - iVar10) + 1 != (int)lVar40);
                }
                lVar27 = lVar27 + 1;
                lVar20 = lVar20 + lVar21 * 8;
                pdVar23 = pdVar23 + lVar29;
                pdVar32 = pdVar32 + local_1c0;
              } while (iVar5 + 1 != (int)lVar27);
            }
            bVar55 = iVar16 != iVar50;
            iVar16 = iVar16 + 1;
          } while (bVar55);
        }
        local_208 = local_208 + 1;
        local_c8 = local_c8 + lVar48;
        local_d0 = local_d0 + local_1e8;
      } while (local_208 != (uint)ncomp);
    }
  }
  pVar17 = anon_unknown.dwarf_5208a2::has_extdir_or_ho(bcrec,ncomp,1);
  if (((((ushort)pVar17 & 1) == 0) || (iVar7 < iVar12 + -1)) &&
     ((((ushort)pVar17 >> 8 & 1) == 0 || (iVar34 < iVar8)))) {
    uVar6 = (q->begin).y;
    if (0 < ncomp) {
      lVar21 = vmac->jstride;
      lVar29 = vmac->kstride;
      iVar1 = (vmac->begin).z;
      lVar41 = yedge->jstride;
      lVar54 = yedge->kstride;
      lVar48 = yedge->nstride;
      iVar3 = (yedge->begin).z;
      iVar7 = (yedge->begin).y;
      iVar8 = (vmac->begin).x;
      iVar42 = (vmac->begin).y;
      pdVar15 = vmac->p;
      local_200 = yedge->p + (lVar31 - (yedge->begin).x);
      local_1d8 = local_1e0 + (lVar31 - (q->begin).x);
      lVar52 = local_1c0 * 8;
      local_230 = (double *)0x0;
      do {
        if (iVar11 <= iVar50) {
          iVar13 = iVar11;
          do {
            if (iVar12 <= iVar34) {
              lVar38 = (long)iVar13;
              lVar43 = (lVar38 - (int)local_234) * local_150 * 8;
              lVar26 = lVar19;
              do {
                iVar45 = (int)lVar26;
                if (iVar10 <= iVar4) {
                  iVar35 = d_bcrec_ptr[(long)local_230].bc[4];
                  lVar46 = (lVar26 - iVar42) * lVar21 * 8 +
                           (lVar38 - iVar1) * lVar29 * 8 + lVar31 * 8 + (long)iVar8 * -8;
                  lVar51 = 0;
                  do {
                    dVar58 = *(double *)
                              ((long)local_1d8 +
                              lVar51 * 8 + (lVar26 - (int)uVar6) * lVar52 + lVar43);
                    dVar64 = *(double *)
                              ((long)local_1d8 +
                              lVar51 * 8 + (int)(~uVar6 + iVar45) * lVar52 + lVar43);
                    dVar59 = (dVar58 - dVar64) + (dVar58 - dVar64);
                    dVar68 = *(double *)
                              ((long)local_1d8 +
                              lVar51 * 8 + (int)((iVar45 + 1) - uVar6) * lVar52 + lVar43);
                    dVar66 = *(double *)
                              ((long)local_1d8 +
                              lVar51 * 8 + (int)((iVar45 - uVar6) + -2) * lVar52 + lVar43);
                    dVar65 = dVar68 - dVar58;
                    dVar63 = dVar64 - dVar66;
                    dVar65 = dVar65 + dVar65;
                    dVar63 = dVar63 + dVar63;
                    auVar60._0_8_ = ABS(dVar65);
                    auVar60._8_8_ = ABS(dVar59);
                    dVar68 = (dVar68 - dVar64) * 0.5;
                    dVar66 = (dVar58 - dVar66) * 0.5;
                    uVar67 = -(ulong)(0.0 < dVar68);
                    uVar57 = -(ulong)(0.0 < dVar66);
                    auVar75._0_8_ = ABS(dVar68);
                    auVar75._8_8_ = ABS(dVar66);
                    auVar70._8_8_ = ABS(dVar63);
                    auVar70._0_8_ = auVar60._8_8_;
                    auVar77 = minpd(auVar75,auVar70);
                    auVar77 = minpd(auVar60,auVar77);
                    uVar69 = -(ulong)(0.0 < dVar59 * dVar65) & auVar77._0_8_;
                    uVar72 = -(ulong)(0.0 < dVar59 * dVar63) & auVar77._8_8_;
                    dVar68 = (double)(~uVar67 & (uVar69 ^ 0x8000000000000000) | uVar69 & uVar67) *
                             -0.5 + dVar58;
                    dVar66 = (double)(~uVar57 & (uVar72 ^ 0x8000000000000000) | uVar72 & uVar57) *
                             0.5 + dVar64;
                    if (lVar26 == lVar24) {
                      dVar58 = dVar68;
                      switch(d_bcrec_ptr[(long)local_230].bc[1]) {
                      case 1:
                        dVar66 = dVar68;
                        break;
                      case 2:
                      case 4:
                        dVar66 = dVar68;
                        if (((local_230 == (double *)0x1 && is_velocity) &&
                             0.0 <= *(double *)((long)pdVar15 + lVar51 * 8 + lVar46)) &&
                           (dVar58 = 0.0, dVar66 = 0.0, dVar68 <= 0.0)) {
                          dVar58 = dVar68;
                          dVar66 = dVar68;
                        }
                        break;
                      case 3:
                        dVar66 = dVar64;
                        if (local_230 == (double *)0x1 && is_velocity) {
                          dVar58 = dVar64;
                        }
                        break;
                      case -1:
                        dVar58 = 0.0;
                        dVar66 = 0.0;
                      }
                      dVar68 = dVar58;
                      dVar64 = dVar66;
                      if (lVar26 == lVar25 + 1) goto switchD_003aeaff_caseD_0;
                    }
                    else {
                      dVar64 = dVar66;
                      if (lVar26 == lVar25 + 1) {
                        switch(iVar35) {
                        case 1:
                        case 2:
                        case 4:
                          dVar68 = dVar66;
                        default:
switchD_003aeaff_caseD_0:
                          dVar64 = dVar66;
                          if ((((iVar35 == 4) || (iVar35 == 2)) &&
                              (dVar68 = dVar66,
                              (local_230 == (double *)0x1 && is_velocity) &&
                              *(double *)((long)pdVar15 + lVar51 * 8 + lVar46) <= 0.0)) &&
                             (dVar68 = 0.0, dVar64 = 0.0, 0.0 <= dVar66)) {
                            dVar68 = dVar66;
                            dVar64 = dVar66;
                          }
                          break;
                        case 3:
                          dVar68 = dVar58;
                          if (local_230 == (double *)0x1 && is_velocity) {
                            dVar64 = dVar58;
                          }
                          break;
                        case -1:
                          dVar68 = 0.0;
                          dVar64 = 0.0;
                        }
                      }
                    }
                    dVar58 = *(double *)((long)pdVar15 + lVar51 * 8 + lVar46);
                    dVar66 = dVar64;
                    if ((dVar58 <= 1e-08) && (dVar66 = dVar68, -1e-08 <= dVar58)) {
                      dVar66 = (dVar64 + dVar68) * 0.5;
                    }
                    *(double *)
                     ((long)local_200 +
                     lVar51 * 8 + (lVar26 - iVar7) * lVar41 * 8 + (lVar38 - iVar3) * lVar54 * 8) =
                         dVar66;
                    lVar51 = lVar51 + 1;
                  } while ((iVar4 - iVar10) + 1 != (int)lVar51);
                }
                lVar26 = lVar26 + 1;
              } while (iVar45 + 1 != iVar34 + 1);
            }
            bVar56 = iVar13 != iVar50;
            iVar13 = iVar13 + 1;
          } while (bVar56);
        }
        local_230 = (double *)((long)local_230 + 1);
        local_200 = local_200 + lVar48;
        local_1d8 = local_1d8 + local_1e8;
      } while (local_230 != (double *)(ulong)(uint)ncomp);
    }
  }
  else {
    uVar6 = (q->begin).y;
    if (0 < ncomp) {
      lVar21 = vmac->jstride;
      lVar29 = yedge->jstride;
      lVar41 = yedge->kstride;
      lVar54 = yedge->nstride;
      iVar1 = (vmac->begin).x;
      iVar35 = iVar8 + 1;
      lVar52 = (long)(q->begin).x;
      iVar3 = (yedge->begin).z;
      local_1a0 = yedge->p + (lVar31 - (yedge->begin).x);
      iVar42 = (yedge->begin).y;
      pdVar15 = vmac->p;
      lVar48 = vmac->kstride;
      iVar13 = (vmac->begin).z;
      iVar45 = (vmac->begin).y;
      local_f8 = local_1e0 + (((int)(iVar35 - uVar6) * local_1c0 + lVar31) - lVar52);
      local_100 = local_1e0 + (lVar31 - lVar52);
      local_148 = local_1e0 + (((int)(iVar7 + ~uVar6) * local_1c0 + lVar31) - lVar52);
      lVar52 = local_1c0 * 8;
      local_220 = 0;
      do {
        if (iVar11 <= iVar50) {
          iVar16 = iVar11;
          do {
            if (iVar12 <= iVar34) {
              lVar38 = (long)iVar16;
              lVar43 = (lVar38 - (int)local_234) * local_150 * 8;
              lVar26 = lVar19;
              do {
                iVar37 = (int)lVar26;
                if (iVar10 <= iVar4) {
                  iVar14 = d_bcrec_ptr[local_220].bc[1];
                  iVar36 = d_bcrec_ptr[local_220].bc[4];
                  bVar55 = 1 < iVar14 - 3U;
                  bVar56 = iVar14 == 4 || iVar36 == 3;
                  iVar49 = (int)(lVar26 + -1);
                  lVar46 = (lVar26 - iVar45) * lVar21 * 8 +
                           (lVar38 - iVar13) * lVar48 * 8 + lVar31 * 8 + (long)iVar1 * -8;
                  lVar51 = 0;
                  do {
                    if (lVar24 < lVar26 || iVar14 != 3) {
                      if ((lVar26 != lVar25 && lVar25 <= lVar26) && iVar36 == 3) {
                        dVar58 = *(double *)((long)local_f8 + lVar51 * 8 + lVar43);
                      }
                      else {
                        dVar58 = *(double *)
                                  ((long)local_100 +
                                  lVar51 * 8 + (lVar26 - (int)uVar6) * lVar52 + lVar43);
                        dVar68 = *(double *)
                                  ((long)local_100 +
                                  lVar51 * 8 + ((lVar26 + -1) - (long)(int)uVar6) * lVar52 + lVar43)
                        ;
                        dVar64 = *(double *)
                                  ((long)local_100 +
                                  lVar51 * 8 + (int)((iVar37 + 1) - uVar6) * lVar52 + lVar43);
                        if (lVar26 != lVar24 || bVar55) {
                          dVar66 = (dVar64 - dVar68) * 0.5;
                          if (lVar26 == lVar25 && bVar56) {
                            dVar66 = (dVar64 * 4.0 + dVar58 * -3.0) - dVar68;
                            goto LAB_003ae2dc;
                          }
                        }
                        else {
                          dVar66 = dVar68 * -4.0 + dVar58 * 3.0 + dVar64;
LAB_003ae2dc:
                          dVar66 = dVar66 / 3.0;
                        }
                        dVar59 = (dVar58 - dVar68) + (dVar58 - dVar68);
                        dVar62 = (dVar64 - dVar58) + (dVar64 - dVar58);
                        dVar64 = ABS(dVar59);
                        dVar63 = ABS(dVar62);
                        dVar65 = ABS(dVar66);
                        if (dVar64 <= ABS(dVar66)) {
                          dVar65 = dVar64;
                        }
                        if (dVar65 <= dVar63) {
                          dVar63 = dVar65;
                        }
                        uVar67 = -(ulong)(0.0 < dVar59 * dVar62) & (ulong)dVar63;
                        dVar65 = *(double *)
                                  ((long)local_100 +
                                  lVar51 * 8 + (int)((iVar37 - uVar6) + -2) * lVar52 + lVar43);
                        if (iVar7 != iVar49 || bVar55) {
                          dVar63 = (dVar58 - dVar65) * 0.5;
                          if (iVar8 == iVar49 && bVar56) {
                            dVar63 = (dVar58 * 4.0 + dVar68 * -3.0) - dVar65;
                            goto LAB_003ae3c0;
                          }
                        }
                        else {
                          dVar63 = dVar65 * -4.0 + dVar68 * 3.0 + dVar58;
LAB_003ae3c0:
                          dVar63 = dVar63 / 3.0;
                        }
                        dVar66 = (double)(~-(ulong)(0.0 < dVar66) & (uVar67 ^ 0x8000000000000000) |
                                         -(ulong)(0.0 < dVar66) & uVar67) * -0.5 + dVar58;
                        dVar62 = (dVar68 - dVar65) + (dVar68 - dVar65);
                        dVar78 = ABS(dVar62);
                        dVar65 = ABS(dVar63);
                        if (dVar78 <= ABS(dVar63)) {
                          dVar65 = dVar78;
                        }
                        if (dVar65 <= dVar64) {
                          dVar64 = dVar65;
                        }
                        uVar67 = -(ulong)(0.0 < dVar59 * dVar62) & (ulong)dVar64;
                        dVar68 = (double)(~-(ulong)(0.0 < dVar63) & (uVar67 ^ 0x8000000000000000) |
                                         -(ulong)(0.0 < dVar63) & uVar67) * 0.5 + dVar68;
                        if (lVar26 == lVar24) {
                          switch(iVar14) {
                          case 1:
switchD_003ae45d_caseD_1:
                            dVar68 = dVar66;
                            break;
                          case 2:
                          case 4:
                            if ((local_220 != 1 || !is_velocity) ||
                                *(double *)((long)pdVar15 + lVar51 * 8 + lVar46) < 0.0)
                            goto switchD_003ae45d_caseD_1;
                            dVar68 = 0.0;
                            if (dVar66 <= 0.0) {
                              dVar68 = dVar66;
                            }
LAB_003ae4ee:
                            dVar66 = dVar68;
                            break;
                          case 3:
                            dVar68 = *(double *)
                                      ((long)local_100 +
                                      lVar51 * 8 + (int)(~uVar6 + iVar37) * lVar52 + lVar43);
                            if (local_220 == 1 && is_velocity) goto LAB_003ae4ee;
                            break;
                          case -1:
                            dVar68 = 0.0;
                            dVar66 = 0.0;
                          }
                          if (lVar26 == iVar35) {
LAB_003ae507:
                            if (((iVar36 == 4) || (iVar36 == 2)) &&
                               (dVar66 = dVar68,
                               (local_220 == 1 && is_velocity) &&
                               *(double *)((long)pdVar15 + lVar51 * 8 + lVar46) <= 0.0)) {
                              dVar58 = 0.0;
                              if (0.0 <= dVar68) {
                                dVar58 = dVar68;
                              }
LAB_003ae544:
                              dVar66 = dVar58;
                              dVar68 = dVar58;
                            }
                          }
                        }
                        else if (lVar26 == iVar35) {
                          switch(iVar36) {
                          case 1:
                          case 2:
                          case 4:
                            dVar66 = dVar68;
                          default:
                            goto LAB_003ae507;
                          case 3:
                            dVar66 = dVar58;
                            if (local_220 != 1 || !is_velocity) break;
                            goto LAB_003ae544;
                          case -1:
                            dVar68 = 0.0;
                            dVar66 = 0.0;
                          }
                        }
                        dVar64 = *(double *)((long)pdVar15 + lVar51 * 8 + lVar46);
                        dVar58 = dVar68;
                        if ((dVar64 <= 1e-08) && (dVar58 = dVar66, -1e-08 <= dVar64)) {
                          dVar58 = (dVar68 + dVar66) * 0.5;
                        }
                      }
                    }
                    else {
                      dVar58 = *(double *)((long)local_148 + lVar51 * 8 + lVar43);
                    }
                    *(double *)
                     ((long)local_1a0 +
                     lVar51 * 8 + (lVar26 - iVar42) * lVar29 * 8 + (lVar38 - iVar3) * lVar41 * 8) =
                         dVar58;
                    lVar51 = lVar51 + 1;
                  } while ((iVar4 - iVar10) + 1 != (int)lVar51);
                }
                lVar26 = lVar26 + 1;
              } while (iVar37 + 1 != iVar34 + 1);
            }
            bVar56 = iVar16 != iVar50;
            iVar16 = iVar16 + 1;
          } while (bVar56);
        }
        local_220 = local_220 + 1;
        local_1a0 = local_1a0 + lVar54;
        local_f8 = local_f8 + local_1e8;
        local_100 = local_100 + local_1e8;
        local_148 = local_148 + local_1e8;
      } while (local_220 != (uint)ncomp);
    }
  }
  pVar17 = anon_unknown.dwarf_5208a2::has_extdir_or_ho(bcrec,ncomp,2);
  if (((pVar17.first & iVar11 + -1 <= iVar2) == 0) &&
     ((((ushort)pVar17 >> 8 & 1) == 0 || (iVar18 < iVar9)))) {
    if (0 < ncomp) {
      lVar24 = wmac->jstride;
      lVar25 = wmac->kstride;
      iVar1 = (wmac->begin).z;
      lVar52 = zedge->jstride;
      lVar21 = zedge->kstride;
      lVar29 = zedge->nstride;
      iVar3 = (wmac->begin).y;
      iVar7 = (wmac->begin).x;
      pdVar15 = wmac->p;
      iVar8 = (zedge->begin).z;
      local_1f8 = zedge->p +
                  (((lVar19 - (zedge->begin).y) * lVar52 + lVar31) - (long)(zedge->begin).x);
      local_1e0 = local_1e0 + (((lVar19 - (int)uVar6) * local_1c0 + lVar31) - (long)(q->begin).x);
      local_150 = local_150 * 8;
      local_230 = (double *)0x0;
      do {
        if (iVar11 <= iVar18) {
          iVar50 = iVar11;
          do {
            if (iVar12 <= iVar5) {
              lVar54 = (long)pdVar15 +
                       (long)(iVar50 - iVar1) * lVar25 * 8 +
                       lVar31 * 8 + (lVar19 - iVar3) * lVar24 * 8 + (long)iVar7 * -8;
              pdVar23 = (double *)((long)(iVar50 - iVar8) * lVar21 * 8 + (long)local_1f8);
              pdVar44 = (double *)((int)((iVar50 - local_234) + -2) * local_150 + (long)local_1e0);
              pdVar22 = (double *)((int)((iVar50 + 1) - local_234) * local_150 + (long)local_1e0);
              pdVar33 = (double *)((int)(~local_234 + iVar50) * local_150 + (long)local_1e0);
              pdVar32 = (double *)((int)(iVar50 - local_234) * local_150 + (long)local_1e0);
              lVar41 = lVar19;
              do {
                if (iVar10 <= iVar4) {
                  iVar34 = d_bcrec_ptr[(long)local_230].bc[5];
                  lVar48 = 0;
                  do {
                    dVar58 = pdVar32[lVar48];
                    dVar64 = pdVar33[lVar48];
                    dVar65 = (dVar58 - dVar64) + (dVar58 - dVar64);
                    dVar68 = pdVar22[lVar48] - dVar58;
                    dVar66 = dVar64 - pdVar44[lVar48];
                    dVar68 = dVar68 + dVar68;
                    dVar66 = dVar66 + dVar66;
                    auVar61._0_8_ = ABS(dVar68);
                    auVar61._8_8_ = ABS(dVar65);
                    dVar63 = (pdVar22[lVar48] - dVar64) * 0.5;
                    dVar59 = (dVar58 - pdVar44[lVar48]) * 0.5;
                    uVar67 = -(ulong)(0.0 < dVar63);
                    uVar57 = -(ulong)(0.0 < dVar59);
                    auVar76._0_8_ = ABS(dVar63);
                    auVar76._8_8_ = ABS(dVar59);
                    auVar71._8_8_ = ABS(dVar66);
                    auVar71._0_8_ = auVar61._8_8_;
                    auVar77 = minpd(auVar76,auVar71);
                    auVar77 = minpd(auVar61,auVar77);
                    uVar69 = -(ulong)(0.0 < dVar65 * dVar68) & auVar77._0_8_;
                    uVar72 = -(ulong)(0.0 < dVar65 * dVar66) & auVar77._8_8_;
                    dVar68 = (double)(~uVar67 & (uVar69 ^ 0x8000000000000000) | uVar69 & uVar67) *
                             -0.5 + dVar58;
                    dVar66 = (double)(~uVar57 & (uVar72 ^ 0x8000000000000000) | uVar72 & uVar57) *
                             0.5 + dVar64;
                    if (iVar2 == iVar50) {
                      dVar58 = dVar68;
                      switch(d_bcrec_ptr[(long)local_230].bc[2]) {
                      case 1:
                        dVar66 = dVar68;
                        break;
                      case 2:
                      case 4:
                        dVar66 = dVar68;
                        if (((local_230 == (double *)0x2 && is_velocity) &&
                             0.0 <= *(double *)(lVar54 + lVar48 * 8)) &&
                           (dVar58 = 0.0, dVar66 = 0.0, dVar68 <= 0.0)) {
                          dVar58 = dVar68;
                          dVar66 = dVar68;
                        }
                        break;
                      case 3:
                        dVar66 = dVar64;
                        if (local_230 == (double *)0x2 && is_velocity) {
                          dVar58 = dVar64;
                        }
                        break;
                      case -1:
                        dVar58 = 0.0;
                        dVar66 = 0.0;
                      }
                      dVar68 = dVar58;
                      dVar64 = dVar66;
                      if (iVar9 + 1 == iVar50) goto switchD_003af993_default;
                    }
                    else {
                      dVar64 = dVar66;
                      if (iVar9 + 1 == iVar50) {
                        switch(iVar34) {
                        case 1:
                        case 2:
                        case 4:
                          dVar68 = dVar66;
                        case 0:
                        default:
switchD_003af993_default:
                          dVar64 = dVar66;
                          if ((((iVar34 == 4) || (iVar34 == 2)) &&
                              (dVar68 = dVar66,
                              (local_230 == (double *)0x2 && is_velocity) &&
                              *(double *)(lVar54 + lVar48 * 8) <= 0.0)) &&
                             (dVar68 = 0.0, dVar64 = 0.0, 0.0 <= dVar66)) {
                            dVar68 = dVar66;
                            dVar64 = dVar66;
                          }
                          break;
                        case 3:
                          dVar68 = dVar58;
                          if (local_230 == (double *)0x2 && is_velocity) {
                            dVar64 = dVar58;
                          }
                          break;
                        case -1:
                          dVar68 = 0.0;
                          dVar64 = 0.0;
                        }
                      }
                    }
                    dVar58 = *(double *)(lVar54 + lVar48 * 8);
                    dVar66 = dVar64;
                    if ((dVar58 <= 1e-08) && (dVar66 = dVar68, -1e-08 <= dVar58)) {
                      dVar66 = (dVar64 + dVar68) * 0.5;
                    }
                    pdVar23[lVar48] = dVar66;
                    lVar48 = lVar48 + 1;
                  } while ((iVar4 - iVar10) + 1 != (int)lVar48);
                }
                lVar41 = lVar41 + 1;
                lVar54 = lVar54 + lVar24 * 8;
                pdVar23 = pdVar23 + lVar52;
                pdVar44 = pdVar44 + local_1c0;
                pdVar22 = pdVar22 + local_1c0;
                pdVar33 = pdVar33 + local_1c0;
                pdVar32 = pdVar32 + local_1c0;
              } while (iVar5 + 1 != (int)lVar41);
            }
            iVar50 = iVar50 + 1;
          } while (iVar50 != iVar18 + 1);
        }
        local_230 = (double *)((long)local_230 + 1);
        local_1f8 = local_1f8 + lVar29;
        local_1e0 = local_1e0 + local_1e8;
      } while (local_230 != (double *)(ulong)(uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar24 = wmac->jstride;
    lVar25 = zedge->jstride;
    iVar1 = (wmac->begin).y;
    iVar3 = (wmac->begin).x;
    lVar21 = (long)(q->begin).x;
    iVar50 = iVar9 + 1;
    lVar29 = (lVar19 - (int)uVar6) * local_1c0;
    lVar52 = wmac->kstride;
    pdVar15 = wmac->p;
    iVar7 = (wmac->begin).z;
    local_128 = local_1e0 + (((int)(iVar50 - local_234) * local_150 + lVar29 + lVar31) - lVar21);
    local_138 = local_1e0 + ((lVar29 + lVar31) - lVar21);
    local_130 = local_1e0 + (((int)(iVar2 + ~local_234) * local_150 + lVar29 + lVar31) - lVar21);
    lVar21 = zedge->kstride;
    local_160 = zedge->p +
                (((lVar19 - (zedge->begin).y) * lVar25 + lVar31) - (long)(zedge->begin).x);
    lVar29 = zedge->nstride;
    iVar8 = (zedge->begin).z;
    local_150 = local_150 * 8;
    local_220 = 0;
    do {
      if (iVar11 <= iVar18) {
        iVar34 = iVar11;
        do {
          if (iVar12 <= iVar5) {
            iVar42 = iVar34 + -1;
            lVar54 = (long)pdVar15 +
                     (long)(iVar34 - iVar7) * lVar52 * 8 +
                     lVar31 * 8 + (lVar19 - iVar1) * lVar24 * 8 + (long)iVar3 * -8;
            pdVar47 = (double *)((long)(iVar34 - iVar8) * lVar21 * 8 + (long)local_160);
            local_178 = (double *)((int)(~local_234 + iVar34) * local_150 + (long)local_138);
            local_230 = (double *)((int)((iVar34 - local_234) + -2) * local_150 + (long)local_138);
            pdVar22 = (double *)((int)((iVar34 + 1) - local_234) * local_150 + (long)local_138);
            pdVar44 = (double *)((int)(iVar42 - local_234) * local_150 + (long)local_138);
            pdVar33 = (double *)((int)(iVar34 - local_234) * local_150 + (long)local_138);
            pdVar23 = local_128;
            lVar41 = lVar19;
            pdVar32 = local_130;
            do {
              if (iVar10 <= iVar4) {
                iVar13 = d_bcrec_ptr[local_220].bc[2];
                iVar45 = d_bcrec_ptr[local_220].bc[5];
                bVar55 = 1 < iVar13 - 3U;
                bVar56 = iVar13 == 4 || iVar45 == 3;
                lVar48 = 0;
                do {
                  if (iVar13 == 3 && iVar34 <= iVar2) {
                    dVar58 = pdVar32[lVar48];
                  }
                  else {
                    if (iVar9 < iVar34 && iVar45 == 3) {
                      dVar58 = pdVar23[lVar48];
                      goto LAB_003af191;
                    }
                    dVar58 = pdVar33[lVar48];
                    dVar68 = pdVar44[lVar48];
                    dVar64 = pdVar22[lVar48];
                    if (iVar2 != iVar34 || bVar55) {
                      dVar66 = (dVar64 - dVar68) * 0.5;
                      if (iVar9 == iVar34 && bVar56) {
                        dVar66 = (dVar64 * 4.0 + dVar58 * -3.0) - dVar68;
                        goto LAB_003af217;
                      }
                    }
                    else {
                      dVar66 = dVar68 * -4.0 + dVar58 * 3.0 + dVar64;
LAB_003af217:
                      dVar66 = dVar66 / 3.0;
                    }
                    dVar59 = (dVar58 - dVar68) + (dVar58 - dVar68);
                    dVar62 = (dVar64 - dVar58) + (dVar64 - dVar58);
                    dVar64 = ABS(dVar59);
                    dVar63 = ABS(dVar62);
                    dVar65 = ABS(dVar66);
                    if (dVar64 <= ABS(dVar66)) {
                      dVar65 = dVar64;
                    }
                    if (dVar65 <= dVar63) {
                      dVar63 = dVar65;
                    }
                    uVar67 = -(ulong)(0.0 < dVar59 * dVar62) & (ulong)dVar63;
                    dVar65 = local_230[lVar48];
                    if (iVar42 != iVar2 || bVar55) {
                      dVar63 = (dVar58 - dVar65) * 0.5;
                      if (bVar56 && iVar42 == iVar9) {
                        dVar63 = (dVar58 * 4.0 + dVar68 * -3.0) - dVar65;
                        goto LAB_003af302;
                      }
                    }
                    else {
                      dVar63 = dVar65 * -4.0 + dVar68 * 3.0 + dVar58;
LAB_003af302:
                      dVar63 = dVar63 / 3.0;
                    }
                    dVar66 = (double)(~-(ulong)(0.0 < dVar66) & (uVar67 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar66) & uVar67) * -0.5 + dVar58;
                    dVar62 = (dVar68 - dVar65) + (dVar68 - dVar65);
                    dVar78 = ABS(dVar62);
                    dVar65 = ABS(dVar63);
                    if (dVar78 <= ABS(dVar63)) {
                      dVar65 = dVar78;
                    }
                    if (dVar65 <= dVar64) {
                      dVar64 = dVar65;
                    }
                    uVar67 = -(ulong)(0.0 < dVar59 * dVar62) & (ulong)dVar64;
                    dVar68 = (double)(~-(ulong)(0.0 < dVar63) & (uVar67 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar63) & uVar67) * 0.5 + dVar68;
                    if (iVar2 == iVar34) {
                      switch(iVar13) {
                      case 0:
                        break;
                      case 1:
switchD_003af39d_caseD_1:
                        dVar68 = dVar66;
                        break;
                      case 2:
                      case 4:
                        if ((local_220 != 2 || !is_velocity) ||
                            *(double *)(lVar54 + lVar48 * 8) < 0.0) goto switchD_003af39d_caseD_1;
                        dVar68 = 0.0;
                        if (dVar66 <= 0.0) {
                          dVar68 = dVar66;
                        }
LAB_003af433:
                        dVar66 = dVar68;
                        dVar68 = dVar66;
                        break;
                      case 3:
                        dVar68 = local_178[lVar48];
                        if (local_220 == 2 && is_velocity) goto LAB_003af433;
                        break;
                      case -1:
                        dVar68 = 0.0;
                        dVar66 = 0.0;
                        break;
                      default:
                        goto switchD_003af39d_default;
                      }
switchD_003af39d_default:
                      if (iVar50 == iVar34) {
switchD_003af3fa_default:
                        if (((iVar45 == 4) || (iVar45 == 2)) &&
                           (dVar66 = dVar68,
                           (local_220 == 2 && is_velocity) &&
                           *(double *)(lVar54 + lVar48 * 8) <= 0.0)) {
                          dVar58 = 0.0;
                          if (0.0 <= dVar68) {
                            dVar58 = dVar68;
                          }
LAB_003af488:
                          dVar66 = dVar58;
                          dVar68 = dVar58;
                        }
                      }
                    }
                    else if (iVar50 == iVar34) {
                      switch(iVar45) {
                      case 1:
                      case 2:
                      case 4:
                        dVar66 = dVar68;
                      case 0:
                        break;
                      case 3:
                        dVar66 = dVar58;
                        if (local_220 != 2 || !is_velocity) goto LAB_003af4b8;
                        goto LAB_003af488;
                      case -1:
                        dVar68 = 0.0;
                        dVar66 = 0.0;
                        goto LAB_003af4b8;
                      default:
                        break;
                      }
                      goto switchD_003af3fa_default;
                    }
LAB_003af4b8:
                    dVar64 = *(double *)(lVar54 + lVar48 * 8);
                    dVar58 = dVar68;
                    if ((dVar64 <= 1e-08) && (dVar58 = dVar66, -1e-08 <= dVar64)) {
                      dVar58 = (dVar68 + dVar66) * 0.5;
                    }
                  }
LAB_003af191:
                  pdVar47[lVar48] = dVar58;
                  lVar48 = lVar48 + 1;
                } while ((iVar4 - iVar10) + 1 != (int)lVar48);
              }
              lVar41 = lVar41 + 1;
              lVar54 = lVar54 + lVar24 * 8;
              pdVar47 = pdVar47 + lVar25;
              pdVar23 = pdVar23 + local_1c0;
              local_178 = local_178 + local_1c0;
              local_230 = local_230 + local_1c0;
              pdVar22 = pdVar22 + local_1c0;
              pdVar44 = pdVar44 + local_1c0;
              pdVar33 = pdVar33 + local_1c0;
              pdVar32 = pdVar32 + local_1c0;
            } while (iVar5 + 1 != (int)lVar41);
          }
          iVar34 = iVar34 + 1;
        } while (iVar34 != iVar18 + 1);
      }
      local_220 = local_220 + 1;
      local_160 = local_160 + lVar29;
      local_128 = local_128 + local_1e8;
      local_138 = local_138 + local_1e8;
      local_130 = local_130 + local_1e8;
    } while (local_220 != (uint)ncomp);
  }
  return;
}

Assistant:

void
MOL::ComputeEdgeState (const Box& bx,
                       AMREX_D_DECL( Array4<Real> const& xedge,
                                     Array4<Real> const& yedge,
                                     Array4<Real> const& zedge),
                       Array4<Real const> const& q,
                       const int ncomp,
                       AMREX_D_DECL( Array4<Real const> const& umac,
                                     Array4<Real const> const& vmac,
                                     Array4<Real const> const& wmac),
                       const Box&       domain,
                       const Vector<BCRec>& bcs,
                       const        BCRec * d_bcrec_ptr,
                       bool         is_velocity)
{
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM==3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 0);
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= ubx.bigEnd(0)))
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state_extdir( i, j, k, n, q, umac,
                                                                d_bcrec_ptr,
                                                                domain_ilo, domain_ihi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state( i, j, k, n, q, umac,
                                                         d_bcrec_ptr,
                                                         domain_ilo, domain_ihi,
                                                         is_velocity);
        });
    }

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 1);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi && domain_jhi <= vbx.bigEnd(1)))
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state_extdir( i, j, k, n, q, vmac,
                                                                d_bcrec_ptr,
                                                                domain_jlo, domain_jhi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state( i, j, k, n, q, vmac,
                                                         d_bcrec_ptr,
                                                         domain_jlo, domain_jhi,
                                                         is_velocity);
        });
    }


#if ( AMREX_SPACEDIM ==3 )

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 2);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= wbx.bigEnd(2)))
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state_extdir( i, j, k, n, q, wmac,
                                                                d_bcrec_ptr,
                                                                domain_klo, domain_khi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state( i, j, k, n, q, wmac,
                                                         d_bcrec_ptr,
                                                         domain_klo, domain_khi,
                                                         is_velocity);
        });
    }

#endif
}